

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.c
# Opt level: O2

void grd_flupgrad(grd_st_t *grd_st,seq_t *seq)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  mdl_t *pmVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  ulong uVar13;
  uint32_t y;
  ulong uVar14;
  uint32_t y_1;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  
  pmVar6 = grd_st->mdl;
  pdVar7 = grd_st->g;
  uVar13 = (ulong)pmVar6->nlbl;
  uVar5 = seq->len;
  pdVar8 = grd_st->psi;
  pdVar9 = grd_st->alpha;
  pdVar10 = grd_st->beta;
  pdVar11 = grd_st->unorm;
  pdVar12 = grd_st->bnorm;
  for (uVar16 = 0; uVar16 != uVar5; uVar16 = uVar16 + 1) {
    for (uVar14 = 0; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      dVar1 = pdVar9[uVar16 * uVar13 + uVar14];
      dVar2 = pdVar10[uVar16 * uVar13 + uVar14];
      dVar3 = pdVar11[uVar16];
      for (uVar17 = 0; uVar17 < *(uint *)&seq[uVar16 * 2 + 1].field_0x4; uVar17 = uVar17 + 1) {
        atm_inc(pdVar7 + uVar14 + pmVar6->uoff
                                  [*(long *)(*(long *)(seq + uVar16 * 2 + 2) + uVar17 * 8)],
                dVar1 * dVar2 * dVar3);
      }
    }
  }
  for (uVar16 = 1; uVar16 < uVar5; uVar16 = uVar16 + 1) {
    uVar17 = 0;
    for (uVar14 = 0; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      for (uVar15 = 0; uVar15 != uVar13; uVar15 = uVar15 + 1) {
        dVar1 = pdVar9[(uVar16 - 1) * uVar13 + uVar14];
        dVar2 = pdVar10[uVar16 * uVar13 + uVar15];
        dVar3 = pdVar8[uVar13 * uVar13 * uVar16 + uVar14 * uVar13 + uVar15];
        dVar4 = pdVar12[uVar16];
        for (uVar18 = 0; uVar18 < *(uint *)&seq[uVar16 * 2 + 1].raw; uVar18 = uVar18 + 1) {
          atm_inc(pdVar7 + uVar17 + pmVar6->boff[seq[uVar16 * 2 + 2].raw[uVar18]],
                  dVar1 * dVar2 * dVar3 * dVar4);
        }
        uVar17 = (ulong)((int)uVar17 + 1);
      }
    }
  }
  return;
}

Assistant:

void grd_flupgrad(grd_st_t *grd_st, const seq_t *seq) {
	const mdl_t *mdl = grd_st->mdl;
	const uint32_t Y = mdl->nlbl;
	const uint32_t T = seq->len;
	const double (*psi  )[T][Y][Y] = (void *)grd_st->psi;
	const double (*alpha)[T][Y]    = (void *)grd_st->alpha;
	const double (*beta )[T][Y]    = (void *)grd_st->beta;
	const double  *unorm           =         grd_st->unorm;
	const double  *bnorm           =         grd_st->bnorm;
	double *g = grd_st->g;
	for (uint32_t t = 0; t < T; t++) {
		const pos_t *pos = &(seq->pos[t]);
		for (uint32_t y = 0; y < Y; y++) {
			double e = (*alpha)[t][y] * (*beta)[t][y] * unorm[t];
			for (uint32_t n = 0; n < pos->ucnt; n++) {
				const uint64_t o = pos->uobs[n];
				atm_inc(g + mdl->uoff[o] + y, e);
			}
		}
	}
	for (uint32_t t = 1; t < T; t++) {
		const pos_t *pos = &(seq->pos[t]);
		for (uint32_t yp = 0, d = 0; yp < Y; yp++) {
			for (uint32_t y = 0; y < Y; y++, d++) {
				double e = (*alpha)[t - 1][yp] * (*beta)[t][y]
				         * (*psi)[t][yp][y] * bnorm[t];
				for (uint32_t n = 0; n < pos->bcnt; n++) {
					const uint64_t o = pos->bobs[n];
					atm_inc(g + mdl->boff[o] + d, e);
				}
			}
		}
	}
}